

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall Generators_Uniform2D_Test::TestBody(Generators_Uniform2D_Test *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *message;
  char *in_R9;
  float fVar3;
  undefined1 auVar4 [64];
  int count;
  AssertionResult gtest_ar_;
  Uniform2DIter __begin1;
  AssertHelper local_90;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined8 local_78;
  undefined8 local_70;
  AssertionResult gtest_ar;
  Uniform2DIter __end1;
  undefined1 extraout_var [56];
  
  count = 0;
  local_80.ptr_._0_4_ = 0x20;
  local_78 = 0;
  local_70 = 0x853c49e6748fea9b;
  pbrt::detail::IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter>::begin
            (&__begin1,(IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter> *)&local_80)
  ;
  pbrt::detail::IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter>::end
            (&__end1,(IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter> *)&local_80);
  iVar2 = 1;
  do {
    if (__begin1.super_RNGIterator<pbrt::detail::Uniform2DIter>.
        super_IndexingIterator<pbrt::detail::Uniform2DIter>.i ==
        __end1.super_RNGIterator<pbrt::detail::Uniform2DIter>.
        super_IndexingIterator<pbrt::detail::Uniform2DIter>.i) {
      local_80.ptr_._0_4_ = 0x20;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"32","count",(int *)&local_80,&count);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_80);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&__begin1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x45b,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&__begin1,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__begin1);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_80);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      return;
    }
    auVar4._0_8_ = pbrt::detail::Uniform2DIter::operator*(&__begin1);
    auVar4._8_56_ = extraout_var;
    if ((auVar4._0_4_ < 0.0) || (1.0 <= auVar4._0_4_)) {
LAB_0037db3d:
      gtest_ar_.success_ = false;
LAB_0037db48:
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"u[0] >= 0 && u[0] < 1 && u[1] >= 0 && u[1] < 1","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x458,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_88);
    }
    else {
      auVar1 = vmovshdup_avx(auVar4._0_16_);
      fVar3 = auVar1._0_4_;
      if (fVar3 < 0.0) goto LAB_0037db3d;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar_.success_ = fVar3 < 1.0;
      if (1.0 <= fVar3) goto LAB_0037db48;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    __begin1.super_RNGIterator<pbrt::detail::Uniform2DIter>.
    super_IndexingIterator<pbrt::detail::Uniform2DIter>.i =
         __begin1.super_RNGIterator<pbrt::detail::Uniform2DIter>.
         super_IndexingIterator<pbrt::detail::Uniform2DIter>.i + 1;
    count = iVar2;
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

TEST(Generators, Uniform2D) {
    int count = 0;
    for (Point2f u : Uniform2D(32)) {
        EXPECT_TRUE(u[0] >= 0 && u[0] < 1 && u[1] >= 0 && u[1] < 1);
        ++count;
    }
    EXPECT_EQ(32, count);
}